

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O1

void duckdb_je_arena_basic_stats_merge
               (tsdn_t *tsdn,arena_t *arena,uint *nthreads,char **dss,ssize_t *dirty_decay_ms,
               ssize_t *muzzy_decay_ms,size_t *nactive,size_t *ndirty,size_t *nmuzzy)

{
  pa_shard_t *shard;
  ssize_t sVar1;
  
  *nthreads = *nthreads + arena->nthreads[0].repr;
  *dss = duckdb_je_dss_prec_names[(arena->dss_prec).repr];
  shard = &arena->pa_shard;
  sVar1 = duckdb_je_pa_decay_ms_get(shard,extent_state_dirty);
  *dirty_decay_ms = sVar1;
  sVar1 = duckdb_je_pa_decay_ms_get(shard,extent_state_muzzy);
  *muzzy_decay_ms = sVar1;
  duckdb_je_pa_shard_basic_stats_merge(shard,nactive,ndirty,nmuzzy);
  return;
}

Assistant:

void
arena_basic_stats_merge(tsdn_t *tsdn, arena_t *arena, unsigned *nthreads,
    const char **dss, ssize_t *dirty_decay_ms, ssize_t *muzzy_decay_ms,
    size_t *nactive, size_t *ndirty, size_t *nmuzzy) {
	*nthreads += arena_nthreads_get(arena, false);
	*dss = dss_prec_names[arena_dss_prec_get(arena)];
	*dirty_decay_ms = arena_decay_ms_get(arena, extent_state_dirty);
	*muzzy_decay_ms = arena_decay_ms_get(arena, extent_state_muzzy);
	pa_shard_basic_stats_merge(&arena->pa_shard, nactive, ndirty, nmuzzy);
}